

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void __thiscall
pixels::compareClose(pixels *this,pixels *o,exr_compression_t comp,char *otag,char *selftag)

{
  bool bVar1;
  uint uVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  ostream *poVar5;
  int *piVar6;
  const_reference pvVar7;
  size_type sVar8;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  uint16_t (*unaff_retaddr) [4];
  uint16_t (*in_stack_00000008) [4];
  size_t idx_3;
  int x_4;
  int y_4;
  size_t idx_2;
  int x_3;
  int y_3;
  int c_1;
  size_t idx_1;
  int x_2;
  int y_2;
  int x2_1;
  int y2_1;
  int x1_1;
  int y1_1;
  int c;
  int x2;
  int y2;
  int x1;
  int y1;
  int x_1;
  int y_1;
  uint16_t unc [4] [4];
  uint16_t orig [4] [4];
  int32_t delta;
  anon_union_4_2_f9ecb1fe b;
  anon_union_4_2_f9ecb1fe a;
  size_t idx;
  int x;
  int y;
  char *in_stack_fffffffffffffea8;
  char *func;
  undefined4 in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb4;
  uint in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  value_type in_stack_fffffffffffffec0;
  uint16_t in_stack_fffffffffffffec2;
  value_type in_stack_fffffffffffffec4;
  undefined2 in_stack_fffffffffffffec6;
  int in_stack_fffffffffffffec8;
  undefined2 uVar9;
  int in_stack_fffffffffffffecc;
  value_type in_stack_fffffffffffffed0;
  value_type in_stack_fffffffffffffed2;
  value_type in_stack_fffffffffffffed4;
  value_type in_stack_fffffffffffffed6;
  uint in_stack_fffffffffffffee0;
  value_type in_stack_fffffffffffffee4;
  int local_108;
  int local_104;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  value_type local_88 [16];
  value_type local_68 [18];
  int local_44;
  value_type local_40;
  value_type local_3c;
  size_type local_38;
  int local_30;
  int local_2c;
  int local_14;
  long local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  for (local_2c = 0; local_2c < in_RDI[1]; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < *in_RDI; local_30 = local_30 + 1) {
      local_38 = (size_type)(local_2c * in_RDI[2] + local_30);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_10 + 0x10),
                          local_38);
      in_stack_fffffffffffffee4 = *pvVar3;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4),local_38);
      in_stack_fffffffffffffea8 = "I";
      compareExact(CONCAT22(in_stack_fffffffffffffec6,in_stack_fffffffffffffec4),
                   CONCAT22(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                   (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),"I",
                   (char *)CONCAT26(in_stack_fffffffffffffed6,
                                    CONCAT24(in_stack_fffffffffffffed4,
                                             CONCAT22(in_stack_fffffffffffffed2,
                                                      in_stack_fffffffffffffed0))));
      if (local_14 == 5) {
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_10 + 0x28),local_38);
        local_3c = *pvVar4;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(in_RDI + 10),local_38);
        local_40 = *pvVar4;
        local_44 = ((uint)local_3c >> 8) - ((uint)local_40 >> 8);
        uVar2 = in_stack_fffffffffffffee0 & 0xffffff;
        if (local_44 < 2) {
          uVar2 = CONCAT13(-2 < local_44,(int3)in_stack_fffffffffffffee0);
        }
        in_stack_fffffffffffffee0 = uVar2;
        if ((char)(in_stack_fffffffffffffee0 >> 0x18) == '\0') {
          poVar5 = std::operator<<((ostream *)&std::cerr,"At ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_30);
          poVar5 = std::operator<<(poVar5,", ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2c);
          std::operator<<(poVar5,":\n");
          core_test_fail((char *)CONCAT26(in_stack_fffffffffffffec6,
                                          CONCAT24(in_stack_fffffffffffffec4,
                                                   CONCAT22(in_stack_fffffffffffffec2,
                                                            in_stack_fffffffffffffec0))),
                         (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8);
        }
      }
      else {
        std::vector<float,_std::allocator<float>_>::operator[]
                  ((vector<float,_std::allocator<float>_> *)(local_10 + 0x28),local_38);
        std::vector<float,_std::allocator<float>_>::operator[]
                  ((vector<float,_std::allocator<float>_> *)(in_RDI + 10),local_38);
        compareExact((float)CONCAT22(in_stack_fffffffffffffed6,in_stack_fffffffffffffed4),
                     (float)CONCAT22(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
                     (char *)CONCAT26(in_stack_fffffffffffffec6,
                                      CONCAT24(in_stack_fffffffffffffec4,
                                               CONCAT22(in_stack_fffffffffffffec2,
                                                        in_stack_fffffffffffffec0))),
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
    }
  }
  if ((local_14 == 6) || (local_14 == 7)) {
    for (local_8c = 0; local_8c < in_RDI[1]; local_8c = local_8c + 4) {
      for (local_90 = 0; local_90 < *in_RDI; local_90 = local_90 + 4) {
        for (local_94 = 0; local_94 < 4; local_94 = local_94 + 1) {
          for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
            local_a0 = local_8c + local_94;
            local_a4 = in_RDI[1] + -1;
            piVar6 = std::min<int>(&local_a0,&local_a4);
            local_9c = *piVar6;
            local_ac = local_90 + local_98;
            local_b0 = *in_RDI + -1;
            piVar6 = std::min<int>(&local_ac,&local_b0);
            local_a8 = *piVar6;
            pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                (local_10 + 0x40),(long)(local_9c * in_RDI[2] + local_a8));
            local_68[(long)local_94 * 4 + (long)local_98] = *pvVar7;
            pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                (in_RDI + 0x10),(long)(local_9c * in_RDI[2] + local_a8));
            local_88[(long)local_94 * 4 + (long)local_98] = *pvVar7;
          }
        }
        bVar1 = withinB44ErrorBounds(in_stack_00000008,unaff_retaddr);
        if (!bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"At ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_90);
          poVar5 = std::operator<<(poVar5,", ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_8c);
          std::operator<<(poVar5,":\n");
          core_test_fail((char *)CONCAT26(in_stack_fffffffffffffec6,
                                          CONCAT24(in_stack_fffffffffffffec4,
                                                   CONCAT22(in_stack_fffffffffffffec2,
                                                            in_stack_fffffffffffffec0))),
                         (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8);
        }
        for (local_b4 = 0; local_b4 < 4; local_b4 = local_b4 + 1) {
          for (local_b8 = 0; local_b8 < 4; local_b8 = local_b8 + 1) {
            for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
              local_c4 = local_8c + local_b8;
              local_c8 = in_RDI[1] + -1;
              piVar6 = std::min<int>(&local_c4,&local_c8);
              local_c0 = *piVar6;
              local_d0 = local_90 + local_bc;
              local_d4 = *in_RDI + -1;
              piVar6 = std::min<int>(&local_d0,&local_d4);
              local_cc = *piVar6;
              pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                  (local_10 + 0x58 + (long)local_b4 * 0x18),
                                  (long)(local_c0 * in_RDI[2] + local_cc));
              local_68[(long)local_b8 * 4 + (long)local_bc] = *pvVar7;
              pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                  (in_RDI + (long)local_b4 * 6 + 0x16),
                                  (long)(local_c0 * in_RDI[2] + local_cc));
              local_88[(long)local_b8 * 4 + (long)local_bc] = *pvVar7;
            }
          }
          bVar1 = withinB44ErrorBounds(in_stack_00000008,unaff_retaddr);
          if (!bVar1) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"At ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_90);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_8c);
            std::operator<<(poVar5,":\n");
            core_test_fail((char *)CONCAT26(in_stack_fffffffffffffec6,
                                            CONCAT24(in_stack_fffffffffffffec4,
                                                     CONCAT22(in_stack_fffffffffffffec2,
                                                              in_stack_fffffffffffffec0))),
                           (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8);
          }
        }
      }
    }
  }
  else if ((local_14 == 8) || (local_14 == 9)) {
    for (local_d8 = 0; local_d8 < in_RDI[1]; local_d8 = local_d8 + 1) {
      for (local_dc = 0; local_dc < *in_RDI; local_dc = local_dc + 1) {
        sVar8 = (size_type)(local_d8 * in_RDI[2] + local_dc);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_10 + 0x40),
                   sVar8);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x10),sVar8)
        ;
        func = "H";
        compareExact(in_stack_fffffffffffffed6,in_stack_fffffffffffffed4,
                     CONCAT22(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,
                     (char *)CONCAT26(in_stack_fffffffffffffec6,
                                      CONCAT24(in_stack_fffffffffffffec4,
                                               CONCAT22(in_stack_fffffffffffffec2,
                                                        in_stack_fffffffffffffec0))),
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        for (local_ec = 0; local_ec < 4; local_ec = local_ec + 1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     (local_10 + 0x58 + (long)local_ec * 0x18),sVar8);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     (in_RDI + (long)local_ec * 6 + 0x16),sVar8);
          bVar1 = withinDWAErrorBounds(in_stack_fffffffffffffec4,in_stack_fffffffffffffec2);
          if (!bVar1) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"At ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_dc);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_d8);
            std::operator<<(poVar5,":\n");
            core_test_fail((char *)CONCAT26(in_stack_fffffffffffffec6,
                                            CONCAT24(in_stack_fffffffffffffec4,
                                                     CONCAT22(in_stack_fffffffffffffec2,
                                                              in_stack_fffffffffffffec0))),
                           (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           in_stack_fffffffffffffeb4,func);
          }
        }
      }
    }
  }
  else if (local_14 == 5) {
    for (local_f0 = 0; local_f0 < in_RDI[1]; local_f0 = local_f0 + 1) {
      for (local_f4 = 0; uVar9 = (undefined2)in_stack_fffffffffffffecc, local_f4 < *in_RDI;
          local_f4 = local_f4 + 1) {
        sVar8 = (size_type)(local_f0 * in_RDI[2] + local_f4);
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_10 + 0x40),sVar8);
        in_stack_fffffffffffffecc = CONCAT22(*pvVar7,uVar9);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x10),sVar8)
        ;
        compareExact(in_stack_fffffffffffffed6,in_stack_fffffffffffffed4,
                     CONCAT22(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,
                     (char *)CONCAT26(in_stack_fffffffffffffec6,
                                      CONCAT24(in_stack_fffffffffffffec4,
                                               CONCAT22(in_stack_fffffffffffffec2,
                                                        in_stack_fffffffffffffec0))),
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_10 + 0x58),sVar8);
        in_stack_fffffffffffffed0 = *pvVar7;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x16),sVar8)
        ;
        compareExact(in_stack_fffffffffffffed6,in_stack_fffffffffffffed4,
                     CONCAT22(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,
                     (char *)CONCAT26(in_stack_fffffffffffffec6,
                                      CONCAT24(in_stack_fffffffffffffec4,
                                               CONCAT22(in_stack_fffffffffffffec2,
                                                        in_stack_fffffffffffffec0))),
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_10 + 0x70),sVar8);
        in_stack_fffffffffffffed2 = *pvVar7;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x1c),sVar8)
        ;
        compareExact(in_stack_fffffffffffffed6,in_stack_fffffffffffffed4,
                     CONCAT22(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,
                     (char *)CONCAT26(in_stack_fffffffffffffec6,
                                      CONCAT24(in_stack_fffffffffffffec4,
                                               CONCAT22(in_stack_fffffffffffffec2,
                                                        in_stack_fffffffffffffec0))),
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_10 + 0x88),sVar8);
        in_stack_fffffffffffffed4 = *pvVar7;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x22),sVar8)
        ;
        compareExact(in_stack_fffffffffffffed6,in_stack_fffffffffffffed4,
                     CONCAT22(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,
                     (char *)CONCAT26(in_stack_fffffffffffffec6,
                                      CONCAT24(in_stack_fffffffffffffec4,
                                               CONCAT22(in_stack_fffffffffffffec2,
                                                        in_stack_fffffffffffffec0))),
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_10 + 0xa0),sVar8);
        in_stack_fffffffffffffed6 = *pvVar7;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x28),sVar8)
        ;
        compareExact(in_stack_fffffffffffffed6,in_stack_fffffffffffffed4,
                     CONCAT22(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,
                     (char *)CONCAT26(in_stack_fffffffffffffec6,
                                      CONCAT24(in_stack_fffffffffffffec4,
                                               CONCAT22(in_stack_fffffffffffffec2,
                                                        in_stack_fffffffffffffec0))),
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      }
    }
  }
  else {
    for (local_104 = 0; local_104 < in_RDI[1]; local_104 = local_104 + 1) {
      for (local_108 = 0; local_108 < *in_RDI; local_108 = local_108 + 1) {
        sVar8 = (size_type)(local_104 * in_RDI[2] + local_108);
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_10 + 0x40),sVar8);
        uVar2 = (uint)*pvVar7;
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + 0x10),sVar8);
        if (uVar2 != *pvVar7) {
          core_test_fail((char *)CONCAT26(in_stack_fffffffffffffec6,
                                          CONCAT24(in_stack_fffffffffffffec4,
                                                   CONCAT22(in_stack_fffffffffffffec2,
                                                            in_stack_fffffffffffffec0))),
                         (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8);
        }
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_10 + 0x58),sVar8);
        in_stack_fffffffffffffec4 = *pvVar7;
        in_stack_fffffffffffffec6 = 0;
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + 0x16),sVar8);
        if (CONCAT22(in_stack_fffffffffffffec6,in_stack_fffffffffffffec4) != (uint)*pvVar7) {
          core_test_fail((char *)CONCAT26(in_stack_fffffffffffffec6,
                                          CONCAT24(in_stack_fffffffffffffec4,
                                                   CONCAT22(in_stack_fffffffffffffec2,
                                                            in_stack_fffffffffffffec0))),
                         (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8);
        }
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_10 + 0x70),sVar8);
        in_stack_fffffffffffffec0 = *pvVar7;
        in_stack_fffffffffffffec2 = 0;
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + 0x1c),sVar8);
        if (CONCAT22(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0) != (uint)*pvVar7) {
          core_test_fail((char *)CONCAT26(in_stack_fffffffffffffec6,
                                          CONCAT24(in_stack_fffffffffffffec4,
                                                   CONCAT22(in_stack_fffffffffffffec2,
                                                            in_stack_fffffffffffffec0))),
                         (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8);
        }
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_10 + 0x88),sVar8);
        in_stack_fffffffffffffebc = (uint)*pvVar7;
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + 0x22),sVar8);
        if (in_stack_fffffffffffffebc != *pvVar7) {
          core_test_fail((char *)CONCAT26(in_stack_fffffffffffffec6,
                                          CONCAT24(in_stack_fffffffffffffec4,
                                                   CONCAT22(in_stack_fffffffffffffec2,
                                                            in_stack_fffffffffffffec0))),
                         (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8);
        }
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_10 + 0xa0),sVar8);
        in_stack_fffffffffffffeb8 = (uint)*pvVar7;
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + 0x28),sVar8);
        if (in_stack_fffffffffffffeb8 != *pvVar7) {
          core_test_fail((char *)CONCAT26(in_stack_fffffffffffffec6,
                                          CONCAT24(in_stack_fffffffffffffec4,
                                                   CONCAT22(in_stack_fffffffffffffec2,
                                                            in_stack_fffffffffffffec0))),
                         (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8);
        }
      }
    }
  }
  return;
}

Assistant:

void compareClose (
        const pixels&     o,
        exr_compression_t comp,
        const char*       otag,
        const char*       selftag) const
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;

                compareExact (o.i[idx], i[idx], x, y, otag, selftag, "I");

                if (comp == EXR_COMPRESSION_PXR24)
                {
                    union
                    {
                        uint32_t iv;
                        float    fv;
                    } a, b;
                    a.fv = o.f[idx];
                    b.fv = f[idx];
                    int32_t delta =
                        (int32_t) (a.iv >> 8) - (int32_t) (b.iv >> 8);
                    EXRCORE_TEST_LOCATION (delta < 2 && delta > -2, x, y);
                }
                else
                {
                    // b44 & dwa don't change floats
                    compareExact (o.f[idx], f[idx], x, y, otag, selftag, "F");
                }
            }
        }

        if (comp == EXR_COMPRESSION_B44 || comp == EXR_COMPRESSION_B44A)
        {
            uint16_t orig[4][4], unc[4][4];
            for (int y = 0; y < _h; y += 4)
            {
                for (int x = 0; x < _w; x += 4)
                {
                    for (int y1 = 0; y1 < 4; ++y1)
                    {
                        for (int x1 = 0; x1 < 4; ++x1)
                        {
                            int y2       = std::min (y + y1, _h - 1);
                            int x2       = std::min (x + x1, _w - 1);
                            orig[y1][x1] = o.h[y2 * _stride_x + x2];
                            unc[y1][x1]  = h[y2 * _stride_x + x2];
                        }
                    }
                    EXRCORE_TEST_LOCATION (
                        withinB44ErrorBounds (orig, unc), x, y)
                    for (int c = 0; c < 4; ++c)
                    {

                        for (int y1 = 0; y1 < 4; ++y1)
                        {
                            for (int x1 = 0; x1 < 4; ++x1)
                            {
                                int y2       = std::min (y + y1, _h - 1);
                                int x2       = std::min (x + x1, _w - 1);
                                orig[y1][x1] = o.rgba[c][y2 * _stride_x + x2];
                                unc[y1][x1]  = rgba[c][y2 * _stride_x + x2];
                            }
                        }
                        EXRCORE_TEST_LOCATION (
                            withinB44ErrorBounds (orig, unc), x, y)
                    }
                }
            }
        }
        else if (comp == EXR_COMPRESSION_DWAA || comp == EXR_COMPRESSION_DWAB)
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    compareExact (o.h[idx], h[idx], x, y, otag, selftag, "H");

                    for (int c = 0; c < 4; ++c)
                    {
                        EXRCORE_TEST_LOCATION (
                            withinDWAErrorBounds (o.rgba[c][idx], rgba[c][idx]),
                            x,
                            y)
                    }
                }
            }
        }
        else if (comp == EXR_COMPRESSION_PXR24)
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    compareExact (o.h[idx], h[idx], x, y, otag, selftag, "H");
                    compareExact (
                        o.rgba[0][idx], rgba[0][idx], x, y, otag, selftag, "R");
                    compareExact (
                        o.rgba[1][idx], rgba[1][idx], x, y, otag, selftag, "G");
                    compareExact (
                        o.rgba[2][idx], rgba[2][idx], x, y, otag, selftag, "B");
                    compareExact (
                        o.rgba[3][idx], rgba[3][idx], x, y, otag, selftag, "A");
                }
            }
        }
        else
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    EXRCORE_TEST (o.h[idx] == h[idx]);
                    EXRCORE_TEST (o.rgba[0][idx] == rgba[0][idx]);
                    EXRCORE_TEST (o.rgba[1][idx] == rgba[1][idx]);
                    EXRCORE_TEST (o.rgba[2][idx] == rgba[2][idx]);
                    EXRCORE_TEST (o.rgba[3][idx] == rgba[3][idx]);
                }
            }
        }
    }